

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

float __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(X3DImporter *this,int pAttrIdx)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  element_type *peVar4;
  size_type sVar5;
  const_reference pvVar6;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  char *c;
  value_type local_a4;
  undefined1 local_a0 [4];
  float tvalf;
  string val;
  allocator local_69;
  string local_68;
  undefined4 local_44;
  shared_ptr<const_Assimp::FIValue> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = pAttrIdx;
  pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar3,
             (ulong)floatValue.
                    super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_);
  std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)local_30);
  std::shared_ptr<const_Assimp::FIValue>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&peVar4->value);
    if (sVar5 != 1) {
      val.field_2._M_local_buf[0xb] = '\x01';
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"Invalid float value",&local_69);
      DeadlyImportError::DeadlyImportError(this_00,&local_68);
      val.field_2._M_local_buf[0xb] = '\0';
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    pvVar6 = std::vector<float,_std::allocator<float>_>::front(&peVar4->value);
    this_local._4_4_ = *pvVar6;
    local_44 = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_a0);
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)floatValue.
                                     super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    ParseHelper_FixTruncatedFloatString
              (this,(char *)CONCAT44(extraout_var,iVar2),(string *)local_a0);
    c = (char *)std::__cxx11::string::c_str();
    fast_atoreal_move<float>(c,&local_a4,false);
    this_local._4_4_ = local_a4;
    local_44 = 1;
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::shared_ptr<const_Assimp::FIFloatValue>::~shared_ptr
            ((shared_ptr<const_Assimp::FIFloatValue> *)local_30);
  return this_local._4_4_;
}

Assistant:

float X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(const int pAttrIdx)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        if (floatValue->value.size() == 1) {
            return floatValue->value.front();
        }
        throw DeadlyImportError("Invalid float value");
    }
    else {
        std::string val;
        float tvalf;

        ParseHelper_FixTruncatedFloatString(mReader->getAttributeValue(pAttrIdx), val);
        fast_atoreal_move(val.c_str(), tvalf, false);

        return tvalf;
    }
}